

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<BloatyTest_SimpleBinary_Test>::CreateTest
          (TestFactoryImpl<BloatyTest_SimpleBinary_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x20);
  BloatyTest_SimpleBinary_Test::BloatyTest_SimpleBinary_Test
            ((BloatyTest_SimpleBinary_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }